

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O2

Datatype * __thiscall TypeOpCpoolref::getOutputLocal(TypeOpCpoolref *this,PcodeOp *op)

{
  pointer ppVVar1;
  int iVar2;
  undefined4 extraout_var;
  Datatype *pDVar4;
  int4 i;
  long lVar5;
  uintb local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> refs;
  int *piVar3;
  
  refs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  refs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  refs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar5 = 1;
      ppVVar1 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      lVar5 < (int)((ulong)((long)(op->inrefs).
                                  super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)ppVVar1) >> 3);
      lVar5 = lVar5 + 1) {
    local_50 = (ppVVar1[lVar5]->loc).offset;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&refs,&local_50);
  }
  iVar2 = (*this->cpool->_vptr_ConstantPool[3])(this->cpool,&refs);
  piVar3 = (int *)CONCAT44(extraout_var,iVar2);
  if (piVar3 == (int *)0x0) {
    pDVar4 = TypeOp::getOutputLocal(&this->super_TypeOp,op);
  }
  else if (*piVar3 == 6) {
    pDVar4 = TypeFactory::getBase((this->super_TypeOp).tlst,1,TYPE_BOOL);
  }
  else {
    pDVar4 = *(Datatype **)(piVar3 + 0xc);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&refs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return pDVar4;
}

Assistant:

Datatype *TypeOpCpoolref::getOutputLocal(const PcodeOp *op) const

{
  vector<uintb> refs;
  for(int4 i=1;i<op->numInput();++i)
    refs.push_back(op->getIn(i)->getOffset());
  const CPoolRecord *rec = cpool->getRecord(refs);
  if (rec == (const CPoolRecord *)0)
    return TypeOp::getOutputLocal(op);
  if (rec->getTag() == CPoolRecord::instance_of)
    return tlst->getBase(1,TYPE_BOOL);
  return rec->getType();
}